

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::localconnect(int n)

{
  uint uVar1;
  clientinfo *pcVar2;
  clientinfo *ci;
  clientinfo *local_20;
  
  if (n < 0x80) {
    pcVar2 = (clientinfo *)getclientinfo(n);
  }
  else if ((int)(n - 0x80U) < DAT_00193cd4) {
    pcVar2 = *(clientinfo **)(bots + (ulong)(n - 0x80U) * 8);
  }
  else {
    pcVar2 = (clientinfo *)0x0;
  }
  local_20 = pcVar2;
  privilegemsg(1,"\f7Connected from host IP");
  pcVar2->ownernum = n;
  pcVar2->clientnum = n;
  pcVar2->connectmillis = totalmillis;
  uVar1 = randomMT();
  pcVar2->sessionid = (totalmillis % 10000 + 1) * uVar1 & 0xffffff;
  pcVar2->local = true;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)&connects,&local_20);
  sendservinfo(local_20);
  return;
}

Assistant:

void localconnect(int n)
    {
        clientinfo *ci = getinfo(n);
        privilegemsg(PRIV_MASTER, "\f7Connected from host IP");
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        ci->local = true;
        connects.add(ci);
        sendservinfo(ci);
    }